

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void crnlib::
     hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
     ::move_node(node *pDst,node *pSrc)

{
  undefined3 uVar1;
  node *pSrc_local;
  node *pDst_local;
  
  pDst->super_value_type = pSrc->super_value_type;
  uVar1 = *(undefined3 *)&pSrc->field_0x9;
  pDst->state = pSrc->state;
  *(undefined3 *)&pDst->field_0x9 = uVar1;
  pSrc->state = '\0';
  return;
}

Assistant:

static inline void move_node(node* pDst, node* pSrc) {
    CRNLIB_ASSERT(!pDst->state);

    if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Key) && CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Value)) {
      memcpy(pDst, pSrc, sizeof(node));
    } else {
      if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Key))
        memcpy(&pDst->first, &pSrc->first, sizeof(Key));
      else {
        scalar_type<Key>::construct(&pDst->first, pSrc->first);
        scalar_type<Key>::destruct(&pSrc->first);
      }

      if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Value))
        memcpy(&pDst->second, &pSrc->second, sizeof(Value));
      else {
        scalar_type<Value>::construct(&pDst->second, pSrc->second);
        scalar_type<Value>::destruct(&pSrc->second);
      }

      pDst->state = cStateValid;
    }

    pSrc->state = cStateInvalid;
  }